

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

void __thiscall
spvtools::opt::analysis::ConstantManager::MapConstantToInst
          (ConstantManager *this,Constant *const_value,Instruction *inst)

{
  uint32_t uVar1;
  byte extraout_DL;
  __hashtable *__h;
  undefined1 local_30 [16];
  
  local_30._0_4_ = Instruction::result_id(inst);
  local_30._8_8_ = const_value;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::analysis::Constant_const*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::analysis::Constant_const*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int_const,spvtools::opt::analysis::Constant_const*>>
            (&this->id_to_const_val_);
  if ((extraout_DL & 1) != 0) {
    uVar1 = Instruction::result_id(inst);
    local_30._8_4_ = uVar1;
    local_30._0_8_ = const_value;
    std::
    _Rb_tree<spvtools::opt::analysis::Constant_const*,std::pair<spvtools::opt::analysis::Constant_const*const,unsigned_int>,std::_Select1st<std::pair<spvtools::opt::analysis::Constant_const*const,unsigned_int>>,std::less<spvtools::opt::analysis::Constant_const*>,std::allocator<std::pair<spvtools::opt::analysis::Constant_const*const,unsigned_int>>>
    ::_M_insert_equal<std::pair<spvtools::opt::analysis::Constant_const*const,unsigned_int>>
              ((_Rb_tree<spvtools::opt::analysis::Constant_const*,std::pair<spvtools::opt::analysis::Constant_const*const,unsigned_int>,std::_Select1st<std::pair<spvtools::opt::analysis::Constant_const*const,unsigned_int>>,std::less<spvtools::opt::analysis::Constant_const*>,std::allocator<std::pair<spvtools::opt::analysis::Constant_const*const,unsigned_int>>>
                *)&this->const_val_to_id_,
               (pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int> *)local_30);
  }
  return;
}

Assistant:

void MapConstantToInst(const Constant* const_value, Instruction* inst) {
    if (id_to_const_val_.insert({inst->result_id(), const_value}).second) {
      const_val_to_id_.insert({const_value, inst->result_id()});
    }
  }